

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateFastCmTypeOf
          (Lowerer *this,Instr *compare,RegOpnd *object,IntConstOpnd *typeIdOpnd,Instr *typeOf,
          bool *pfNoLower,bool isNeqOp)

{
  code *pcVar1;
  bool bVar2;
  IRType type;
  OpCode OVar3;
  uint32 uVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  long lVar7;
  LabelInstr *done_00;
  LabelInstr *target_00;
  LabelInstr *target_01;
  Opnd *pOVar8;
  RegOpnd *typeOpnd;
  IndirOpnd *pIVar9;
  RegOpnd *dst_00;
  IntConstOpnd *pIVar10;
  BailOutInfo *bailoutInfo;
  TypeId typeIdToCheck;
  LabelInstr *local_150;
  LabelInstr *local_130;
  LabelInstr *local_110;
  LabelInstr *local_f8;
  LabelInstr *local_e0;
  LabelInstr *local_a8;
  LabelInstr *local_a0;
  RegOpnd *local_90;
  RegOpnd *objTypeIdOpnd;
  LabelInstr *target;
  RegOpnd *newObject;
  RegOpnd *typeRegOpnd;
  RegOpnd *dst;
  LabelInstr *helper;
  LabelInstr *done;
  LabelInstr *movFalse;
  TypeId typeId;
  bool isNeqOp_local;
  bool *pfNoLower_local;
  Instr *typeOf_local;
  IntConstOpnd *typeIdOpnd_local;
  RegOpnd *object_local;
  Instr *compare_local;
  Lowerer *this_local;
  
  if ((((compare->m_opcode != CmSrEq_A) && (compare->m_opcode != CmEq_A)) &&
      (compare->m_opcode != CmSrNeq_A)) && (compare->m_opcode != CmNeq_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x62fc,
                       "(compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  lVar7 = IR::EncodableOpnd<long>::GetValue(&typeIdOpnd->super_EncodableOpnd<long>);
  typeIdToCheck = (TypeId)lVar7;
  done_00 = IR::LabelInstr::New(Label,this->m_func,false);
  target_00 = IR::LabelInstr::New(Label,this->m_func,false);
  target_01 = IR::LabelInstr::New(Label,this->m_func,true);
  pOVar8 = IR::Instr::GetDst(compare);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar8);
  if (bVar2) {
    pOVar8 = IR::Instr::GetDst(compare);
    local_90 = IR::Opnd::AsRegOpnd(pOVar8);
  }
  else {
    local_90 = (RegOpnd *)0x0;
  }
  typeRegOpnd = local_90;
  typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  if (local_90 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6305,"(dst)","dst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = IR::Opnd::IsEqual(&local_90->super_Opnd,&object->super_Opnd);
  typeIdOpnd_local = (IntConstOpnd *)object;
  if (bVar2) {
    type = IR::Opnd::GetType(&object->super_Opnd);
    typeIdOpnd_local = (IntConstOpnd *)IR::RegOpnd::New(type,this->m_func);
    InsertMove((Opnd *)typeIdOpnd_local,&object->super_Opnd,compare,true);
  }
  pOVar8 = LoadLibraryValueOpnd(this,compare,ValueTrue);
  InsertMove(&local_90->super_Opnd,pOVar8,compare,true);
  local_a0 = done_00;
  if (typeIdToCheck == TypeIds_Number) {
    local_a0 = target_00;
  }
  objTypeIdOpnd = (RegOpnd *)local_a0;
  if (isNeqOp) {
    local_a8 = target_00;
    if (local_a0 == target_00) {
      local_a8 = done_00;
    }
    objTypeIdOpnd = (RegOpnd *)local_a8;
  }
  LowererMD::GenerateObjectTest
            (&this->m_lowererMD,&typeIdOpnd_local->super_Opnd,compare,(LabelInstr *)objTypeIdOpnd,
             false);
  uVar4 = Js::RecyclableObject::GetOffsetOfType();
  pIVar9 = IR::IndirOpnd::New((RegOpnd *)typeIdOpnd_local,uVar4,TyInt64,this->m_func,false);
  InsertMove(&typeOpnd->super_Opnd,&pIVar9->super_Opnd,compare,true);
  GenerateFalsyObjectTest(this,compare,typeOpnd,typeIdToCheck,target_00,done_00,isNeqOp);
  dst_00 = IR::RegOpnd::New(TyInt32,this->m_func);
  uVar4 = Js::Type::GetOffsetOfTypeId();
  pIVar9 = IR::IndirOpnd::New(typeOpnd,uVar4,TyInt32,this->m_func,false);
  InsertMove(&dst_00->super_Opnd,&pIVar9->super_Opnd,compare,true);
  if (typeIdToCheck == TypeIds_Object) {
    local_e0 = target_00;
    if (isNeqOp) {
      local_e0 = done_00;
    }
    InsertCompareBranch(this,&dst_00->super_Opnd,&typeIdOpnd->super_Opnd,BrGe_A,local_e0,compare,
                        false);
  }
  else if (typeIdToCheck == TypeIds_Function) {
    local_f8 = target_00;
    if (isNeqOp) {
      local_f8 = done_00;
    }
    InsertCompareBranch(this,&dst_00->super_Opnd,&typeIdOpnd->super_Opnd,BrEq_A,local_f8,compare,
                        false);
  }
  else if (typeIdToCheck == TypeIds_Number) {
    pIVar10 = IR::IntConstOpnd::New(6,TyInt32,compare->m_func,false);
    local_110 = done_00;
    if (isNeqOp) {
      local_110 = target_00;
    }
    InsertCompareBranch(this,&dst_00->super_Opnd,&pIVar10->super_Opnd,BrGt_A,local_110,compare,false
                       );
    pIVar10 = IR::IntConstOpnd::New(3,TyInt32,compare->m_func,false);
    OVar3 = BrGe_A;
    if (isNeqOp) {
      OVar3 = BrLt_A;
    }
    InsertCompareBranch(this,&dst_00->super_Opnd,&pIVar10->super_Opnd,OVar3,target_00,compare,false)
    ;
  }
  else {
    OVar3 = BrEq_A;
    if (isNeqOp) {
      OVar3 = BrNeq_A;
    }
    InsertCompareBranch(this,&dst_00->super_Opnd,&typeIdOpnd->super_Opnd,OVar3,target_00,compare,
                        false);
  }
  if (typeIdToCheck == TypeIds_Object) {
    pOVar8 = LoadLibraryValueOpnd(this,compare,ValueNull);
    local_130 = target_00;
    if (isNeqOp) {
      local_130 = done_00;
    }
    InsertCompareBranch(this,&typeIdOpnd_local->super_Opnd,pOVar8,BrEq_A,local_130,compare,false);
  }
  IR::Instr::InsertAfter(compare,&target_00->super_Instr);
  if ((typeIdToCheck != TypeIds_Object) && (typeIdToCheck != TypeIds_Function)) {
    IR::Instr::Remove(typeOf);
    pOVar8 = IR::Instr::UnlinkDst(compare);
    typeRegOpnd = IR::Opnd::AsRegOpnd(pOVar8);
    IR::Instr::Remove(compare);
    *pfNoLower = true;
    goto LAB_007e7b6b;
  }
  pIVar10 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
  InsertCompareBranch(this,&dst_00->super_Opnd,&pIVar10->super_Opnd,BrEq_A,target_01,compare,false);
  pIVar10 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
  local_150 = done_00;
  if (isNeqOp) {
    local_150 = target_00;
  }
  InsertCompareBranch(this,&dst_00->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,local_150,compare,false)
  ;
  IR::Instr::InsertBefore(compare,&target_01->super_Instr);
  IR::Instr::Unlink(typeOf);
  IR::Instr::InsertBefore(compare,typeOf);
  bVar2 = IR::Instr::HasBailOutInfo(compare);
  pfNoLower_local = (bool *)typeOf;
  if (bVar2) {
    BVar5 = IR::Instr::GetBailOutKind(compare);
    bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar5);
    if (bVar2) {
      bVar2 = IR::Instr::HasBailOutInfo(typeOf);
      if (bVar2) {
        BVar5 = IR::Instr::GetBailOutKind(typeOf);
        bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar5);
        if (bVar2) goto LAB_007e7b13;
      }
      bailoutInfo = IR::Instr::GetBailOutInfo(compare);
      BVar5 = IR::Instr::GetBailOutKind(compare);
      pfNoLower_local = (bool *)AddBailoutToHelperCallInstr(this,typeOf,bailoutInfo,BVar5,compare);
    }
  }
LAB_007e7b13:
  LowerUnaryHelperMem(this,(Instr *)pfNoLower_local,HelperOp_Typeof,(Opnd *)0x0);
  InsertBranch(Br,target_00,&target_00->super_Instr);
LAB_007e7b6b:
  IR::Instr::InsertBefore(&target_00->super_Instr,&done_00->super_Instr);
  pOVar8 = LoadLibraryValueOpnd(this,&target_00->super_Instr,ValueFalse);
  InsertMove(&typeRegOpnd->super_Opnd,pOVar8,&target_00->super_Instr,true);
  return;
}

Assistant:

void
Lowerer::GenerateFastCmTypeOf(IR::Instr *compare, IR::RegOpnd *object, IR::IntConstOpnd *typeIdOpnd, IR::Instr *typeOf, bool *pfNoLower, bool isNeqOp)
{
    Assert(compare->m_opcode == Js::OpCode::CmSrEq_A  ||
           compare->m_opcode == Js::OpCode::CmEq_A    ||
           compare->m_opcode == Js::OpCode::CmSrNeq_A ||
           compare->m_opcode == Js::OpCode::CmNeq_A);

    Js::TypeId      typeId   = static_cast<Js::TypeId>(typeIdOpnd->GetValue());
    IR::LabelInstr *movFalse = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *done = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *helper= IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::RegOpnd    *dst      = compare->GetDst()->IsRegOpnd() ? compare->GetDst()->AsRegOpnd() : nullptr;
    IR::RegOpnd    *typeRegOpnd  = IR::RegOpnd::New(TyMachReg, m_func);

    Assert(dst);

    if (dst->IsEqual(object))
    {
        //dst same as the src of typeof. As we need to move true to dst first we need to save the src to a new opnd
        IR::RegOpnd *newObject = IR::RegOpnd::New(object->GetType(), m_func);
        InsertMove(newObject, object, compare); //Save src
        object = newObject;
    }

    // mov dst, 'true'
    InsertMove(dst,
               LoadLibraryValueOpnd(compare, LibraryValue::ValueTrue),
               compare);

    // TEST object, 1
    // JNE (typeId == Js::TypeIds_Number) ? $done : $movFalse
    IR::LabelInstr *target = (typeId == Js::TypeIds_Number) ? done : movFalse;
    if (isNeqOp)
    {
        target = (target == done) ? movFalse : done;
    }

    m_lowererMD.GenerateObjectTest(object, compare, target);

    // MOV typeRegOpnd, [object + offset(Type)]
    InsertMove(typeRegOpnd,
               IR::IndirOpnd::New(object, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
               compare);

    GenerateFalsyObjectTest(compare, typeRegOpnd, typeId, done, movFalse, isNeqOp);

    // MOV objTypeId, [typeRegOpnd + offset(TypeId)]
    IR::RegOpnd* objTypeIdOpnd = IR::RegOpnd::New(TyInt32, m_func);
    InsertMove(objTypeIdOpnd,
               IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func),
               compare);

    // CMP objTypeId, typeId
    // JEQ/JGE $done
    if (typeId == Js::TypeIds_Object)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrGe_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Function)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrEq_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Number)
    {
        //Check for the typeIds between  TypeIds_FirstNumberType <= typeIds <= TypeIds_LastNumberType
        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_LastNumberType, TyInt32, compare->m_func),
                                Js::OpCode::BrGt_A,
                                isNeqOp ? done : movFalse,
                                compare);

        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_FirstNumberType, TyInt32, compare->m_func),
                                isNeqOp? Js::OpCode::BrLt_A : Js::OpCode::BrGe_A,
                                done,
                                compare);
    }
    else
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, done, compare);
    }

    // This could be 'null' which, for historical reasons, has a TypeId < TypeIds_Object but
    // is still a Javascript "object."
    if (typeId == Js::TypeIds_Object)
    {
        // CMP object, 0xXXXXXXXX
        // JEQ isNeqOp ? $movFalse : $done
        InsertCompareBranch(object,
                            LoadLibraryValueOpnd(compare, LibraryValue::ValueNull),
                            Js::OpCode::BrEq_A,
                            isNeqOp ? movFalse : done,
                            compare);
    }

    compare->InsertAfter(done); // Get this label first

    // "object" or "function" may come from HostDispatch. Needs helper if that's the case.
    if (typeId == Js::TypeIds_Object || typeId == Js::TypeIds_Function)
    {
        // CMP objTypeId, TypeIds_Proxy
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
            IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
            Js::OpCode::BrEq_A,
            helper,
            compare);

        // CMP objTypeId, TypeIds_HostDispatch
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
                            IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
                            Js::OpCode::BrNeq_A,
                            isNeqOp ? done : movFalse,
                            compare);

        // Now emit Typeof like we would've for the helper call.
        {
            compare->InsertBefore(helper);
            typeOf->Unlink();
            compare->InsertBefore(typeOf);
            if (compare->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(compare->GetBailOutKind()) &&
                (!typeOf->HasBailOutInfo() || !BailOutInfo::IsBailOutOnImplicitCalls(typeOf->GetBailOutKind())))
            {
                typeOf = AddBailoutToHelperCallInstr(typeOf, compare->GetBailOutInfo(), compare->GetBailOutKind(), compare);
            }
            LowerUnaryHelperMem(typeOf, IR::HelperOp_Typeof);
        }

        // JMP/B $done
        InsertBranch(Js::OpCode::Br, done, done);
    }
    else // Other primitive types don't need helper
    {
        typeOf->Remove();
        dst = compare->UnlinkDst()->AsRegOpnd();
        compare->Remove();
        *pfNoLower = true;
    }

    // $movFalse: (insert before $done)
    done->InsertBefore(movFalse);

    // MOV dst, 'false'
    InsertMove(dst, LoadLibraryValueOpnd(done, LibraryValue::ValueFalse), done);

    // $done:
}